

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mondata.c
# Opt level: O3

boolean resists_magm(monst *mon)

{
  char cVar1;
  permonst *ppVar2;
  obj *poVar3;
  boolean bVar4;
  boolean bVar5;
  obj **ppoVar6;
  ulong uVar7;
  
  ppVar2 = mon->data;
  uVar7 = 0x10;
  do {
    cVar1 = *(char *)((long)ppVar2->mattk + (uVar7 - 0xf));
    if (0x23 < uVar7) break;
    uVar7 = uVar7 + 4;
  } while (cVar1 != '\x01');
  bVar5 = '\x01';
  if (ppVar2 != mons + 0x89 && cVar1 != '\x01') {
    uVar7 = 0x10;
    do {
      cVar1 = *(char *)((long)ppVar2->mattk + (uVar7 - 0xf));
      if (0x23 < uVar7) break;
      uVar7 = uVar7 + 4;
    } while (cVar1 != -0xe);
    if (cVar1 != -0xe) {
      if (mon == &youmonst) {
        ppoVar6 = &uwep;
      }
      else {
        ppoVar6 = &mon->mw;
      }
      poVar3 = *ppoVar6;
      if (((poVar3 == (obj *)0x0) || (poVar3->oartifact == '\0')) ||
         (bVar4 = defends(1,poVar3), bVar4 == '\0')) {
        if (mon == &youmonst) {
          ppoVar6 = &invent;
        }
        else {
          ppoVar6 = &mon->minvent;
        }
        for (poVar3 = *ppoVar6; poVar3 != (obj *)0x0; poVar3 = poVar3->nobj) {
          if ((poVar3->owornmask != 0) && (objects[poVar3->otyp].oc_oprop == ',')) {
            return '\x01';
          }
          if ((poVar3->oartifact != '\0') && (bVar5 = protects(1,poVar3), bVar5 != '\0')) {
            return '\x01';
          }
        }
        bVar5 = '\0';
      }
    }
  }
  return bVar5;
}

Assistant:

boolean resists_magm(struct monst *mon)
{
	const struct permonst *ptr = mon->data;
	struct obj *o;

	/* as of 3.2.0:  gray dragons, Angels, Oracle, Yeenoghu */
	if (dmgtype(ptr, AD_MAGM) || ptr == &mons[PM_BABY_GRAY_DRAGON] ||
		dmgtype(ptr, AD_RBRE))	/* Chromatic Dragon */
	    return TRUE;
	/* check for magic resistance granted by wielded weapon */
	o = (mon == &youmonst) ? uwep : MON_WEP(mon);
	if (o && o->oartifact && defends(AD_MAGM, o))
	    return TRUE;
	/* check for magic resistance granted by worn or carried items */
	o = (mon == &youmonst) ? invent : mon->minvent;
	for ( ; o; o = o->nobj)
	    if ((o->owornmask && objects[o->otyp].oc_oprop == ANTIMAGIC) ||
		    (o->oartifact && protects(AD_MAGM, o)))
		return TRUE;
	return FALSE;
}